

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_z.cpp
# Opt level: O0

void zscal(int n,complex<double> ca,complex<double> *cx,int incx)

{
  undefined8 *puVar1;
  int iVar2;
  long lVar3;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 in_XMM1_Qa;
  int local_30;
  int i;
  int incx_local;
  complex<double> *cx_local;
  undefined1 auStack_18 [4];
  int n_local;
  complex<double> ca_local;
  
  lVar3 = ca._M_value._0_8_;
  iVar2 = ca._M_value._8_4_;
  if ((0 < n) && (0 < iVar2)) {
    if (iVar2 == 1) {
      for (local_30 = 0; local_30 < n; local_30 = local_30 + 1) {
        std::operator*((complex<double> *)auStack_18,
                       (complex<double> *)(lVar3 + (long)local_30 * 0x10));
        puVar1 = (undefined8 *)(lVar3 + (long)local_30 * 0x10);
        *puVar1 = extraout_XMM0_Qa;
        puVar1[1] = in_XMM1_Qa;
      }
    }
    else {
      for (local_30 = 0; local_30 < n; local_30 = local_30 + 1) {
        std::operator*((complex<double> *)auStack_18,
                       (complex<double> *)(lVar3 + (long)(local_30 * iVar2) * 0x10));
        puVar1 = (undefined8 *)(lVar3 + (long)(local_30 * iVar2) * 0x10);
        *puVar1 = extraout_XMM0_Qa_00;
        puVar1[1] = in_XMM1_Qa;
      }
    }
  }
  return;
}

Assistant:

void zscal ( int n, complex <double> ca, complex <double> cx[], int incx )

//****************************************************************************80
//
//  Purpose:
//
//    ZSCAL scales a complex <double> vector by a complex <double>.
//
//  Discussion:
//
//    This routine uses double precision complex arithmetic.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    15 April 2006
//
//  Author:
//
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Jack Dongarra, Cleve Moler, Jim Bunch, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vector.
//
//    Input, complex <double> CA, the multiplier.
//
//    Input/output, complex <double> CX[], the vector to be scaled.
//
//    Input, int INCX, the increment between successive entries of CX.
//
{
  int i;

  if ( n <= 0 || incx <= 0 )
  {
    return;
  }

  if ( incx == 1 )
  {
    for ( i = 0; i < n; i++ )
    {
      cx[i] = ca * cx[i];
    }
  }
  else
  {
    for ( i = 0; i < n; i++ )
    {
      cx[i*incx] = ca * cx[i*incx];
    }
  }
  return;
}